

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMutex_POSIX.c
# Opt level: O2

UINT8 OSMutex_TryLock(OS_MUTEX *mtx)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)mtx);
  bVar1 = (byte)iVar2;
  if (iVar2 != 0) {
    bVar1 = -(iVar2 != 0x10) | 1;
  }
  return bVar1;
}

Assistant:

UINT8 OSMutex_TryLock(OS_MUTEX* mtx)
{
	int retVal;
	
	retVal = pthread_mutex_trylock(&mtx->hMutex);
	if (! retVal)
		return 0x00;
	else if (retVal == EBUSY)
		return 0x01;
	else
		return 0xFF;
}